

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall Pathie::PathieError::PathieError(PathieError *this)

{
  *(undefined ***)this = &PTR__GlobError_00114bd0;
  (this->m_pathie_errmsg)._M_dataplus._M_p = (pointer)&(this->m_pathie_errmsg).field_2;
  (this->m_pathie_errmsg)._M_string_length = 0;
  (this->m_pathie_errmsg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->m_pathie_errmsg);
  return;
}

Assistant:

PathieError::PathieError()
{
  m_pathie_errmsg = "Unknown pathie exception.";
}